

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O3

void free_wb_list(socket_server *ss,wb_list *list)

{
  write_buffer *pwVar1;
  write_buffer *__ptr;
  write_buffer *tmp;
  
  __ptr = list->head;
  while (__ptr != (write_buffer *)0x0) {
    pwVar1 = __ptr->next;
    if (__ptr->userobject == true) {
      (*(ss->soi).free)(__ptr->buffer);
    }
    else {
      free(__ptr->buffer);
    }
    free(__ptr);
    __ptr = pwVar1;
  }
  list->head = (write_buffer *)0x0;
  list->tail = (write_buffer *)0x0;
  return;
}

Assistant:

static void
free_wb_list(struct socket_server *ss, struct wb_list *list) {
	struct write_buffer *wb = list->head;
	while (wb) {
		struct write_buffer *tmp = wb;
		wb = wb->next;
		write_buffer_free(ss, tmp);
	}
	list->head = NULL;
	list->tail = NULL;
}